

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberValidator.h
# Opt level: O3

string * __thiscall
cursespp::NumberValidator<int>::ErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,NumberValidator<int> *this)

{
  int iVar1;
  ulong uVar2;
  int local_74;
  long *local_70;
  char *local_68;
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = this->maximum;
  f8n::i18n::Locale::Instance();
  if (iVar1 == 0x7fffffff) {
    f8n::i18n::Locale::Translate_abi_cxx11_((char *)__return_storage_ptr__);
  }
  else {
    f8n::i18n::Locale::Translate_abi_cxx11_((char *)__return_storage_ptr__);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{{minimum}}","");
    local_74 = this->minimum;
    if ((this->formatter).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->formatter)._M_invoker)(&local_50,(_Any_data *)&this->formatter,&local_74);
    for (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_70,0);
        uVar2 != 0xffffffffffffffff;
        uVar2 = std::__cxx11::string::find
                          ((char *)__return_storage_ptr__,(ulong)local_70,
                           uVar2 + local_50._M_string_length)) {
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,uVar2,local_68,(ulong)local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{{maximum}}","");
    local_74 = this->maximum;
    if ((this->formatter).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->formatter)._M_invoker)(&local_50,(_Any_data *)&this->formatter,&local_74);
    for (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_70,0);
        uVar2 != 0xffffffffffffffff;
        uVar2 = std::__cxx11::string::find
                          ((char *)__return_storage_ptr__,(ulong)local_70,
                           uVar2 + local_50._M_string_length)) {
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,uVar2,local_68,(ulong)local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string ErrorMessage() const override {
            if (bounded(minimum, maximum)) {
                std::string result = _TSTR("validator_dialog_number_parse_bounded_error");
                f8n::str::replace(result, "{{minimum}}", formatter(minimum));
                f8n::str::replace(result, "{{maximum}}", formatter(maximum));
                return result;
            }
            return _TSTR("validator_dialog_number_parse_error");
        }